

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

void ev3dev::sound::beep(string *args,bool bSynchronous)

{
  ostringstream cmd;
  char *local_1b0;
  char local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"/usr/bin/beep ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(args->_M_dataplus)._M_p,args->_M_string_length);
  if (!bSynchronous) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," &",2);
  }
  std::__cxx11::stringbuf::str();
  system(local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void sound::beep(const std::string &args, bool bSynchronous) {
    std::ostringstream cmd;
    cmd << "/usr/bin/beep " << args;
    if (!bSynchronous) cmd << " &";
    std::system(cmd.str().c_str());
}